

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::LowerBailoutCheckAndLabel(Lowerer *this,Instr *instr,bool onEqual,bool isHelper)

{
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  OpCode assignOpcode;
  BailOutKind BVar4;
  LabelInstr *pLVar5;
  undefined4 *puVar6;
  IntConstOpnd *pIVar7;
  Opnd *compareSrc1;
  Opnd *compareSrc2;
  Lowerer *this_00;
  
  IVar1 = instr->m_next->m_kind;
  if ((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) {
    pLVar5 = IR::Instr::AsLabelInstr(instr->m_next);
  }
  else {
    pLVar5 = IR::LabelInstr::New(Label,this->m_func,isHelper);
    IR::Instr::InsertAfter(instr,&pLVar5->super_Instr);
  }
  BVar4 = IR::Instr::GetBailOutKind(instr);
  if (BVar4 == BailOutInjected) {
    if (!onEqual) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x315d,"(onEqual)","onEqual");
      if (!bVar3) goto LAB_00576fb3;
      *puVar6 = 0;
    }
    bVar3 = IR::Opnd::IsEqual(instr->m_src1,instr->m_src2);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x315e,"(instr->GetSrc1()->IsEqual(instr->GetSrc2()))",
                         "instr->GetSrc1()->IsEqual(instr->GetSrc2())");
      if (!bVar3) goto LAB_00576fb3;
      *puVar6 = 0;
    }
    pIVar7 = IR::Opnd::AsIntConstOpnd(instr->m_src1);
    if ((pIVar7->super_EncodableOpnd<long>).m_value != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x315f,"(instr->GetSrc1()->AsIntConstOpnd()->GetValue() == 0)",
                         "instr->GetSrc1()->AsIntConstOpnd()->GetValue() == 0");
      if (!bVar3) {
LAB_00576fb3:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    assignOpcode = LowererMDArch::GetAssignOp(instr->m_src1->m_type);
    IR::Instr::HoistSrc1(instr,assignOpcode,RegNOREG,(StackSym *)0x0);
  }
  compareSrc1 = IR::Instr::UnlinkSrc1(instr);
  this_00 = (Lowerer *)instr;
  compareSrc2 = IR::Instr::UnlinkSrc2(instr);
  InsertCompareBranch(this_00,compareSrc1,compareSrc2,onEqual | BrEq_A,pLVar5,instr,false);
  if (!isHelper) {
    pLVar5 = IR::LabelInstr::New(Label,this->m_func,true);
    IR::Instr::InsertBefore(instr,&pLVar5->super_Instr);
    (pLVar5->super_Instr).m_noLazyHelperAssert = true;
  }
  return;
}

Assistant:

void
Lowerer::LowerBailoutCheckAndLabel(IR::Instr *instr, bool onEqual, bool isHelper)
{
    // Label to skip Bailout and continue
    IR::LabelInstr * continueLabelInstr;
    IR::Instr *instrNext = instr->m_next;
    if (instrNext->IsLabelInstr())
    {
        continueLabelInstr = instrNext->AsLabelInstr();
    }
    else
    {
        continueLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func, isHelper);
        instr->InsertAfter(continueLabelInstr);
    }

    if(instr->GetBailOutKind() == IR::BailOutInjected)
    {
        // BailOnEqual 0, 0
        Assert(onEqual);
        Assert(instr->GetSrc1()->IsEqual(instr->GetSrc2()));
        Assert(instr->GetSrc1()->AsIntConstOpnd()->GetValue() == 0);

        // The operands cannot be equal when generating a compare (assert) but since this is for testing purposes, hoist a src.
        // Ideally, we would just create a BailOut instruction that generates a guaranteed bailout, but there seem to be issues
        // with doing this in a non-helper path. So finally, it would generate:
        //     xor s0, s0
        //     test s0, s0
        //     jnz $continue
        //   $bailout:
        //     // bailout
        //   $continue:
        instr->HoistSrc1(LowererMD::GetLoadOp(instr->GetSrc1()->GetType()));
    }

    InsertCompareBranch(instr->UnlinkSrc1(), instr->UnlinkSrc2(),
        onEqual ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, continueLabelInstr, instr);

    if (!isHelper)
    {
        IR::LabelInstr * helperLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
        instr->InsertBefore(helperLabelInstr);
#if DBG
        helperLabelInstr->m_noLazyHelperAssert = true;
#endif
    }
}